

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

Eci * __thiscall SGP4::FindPositionSGP4(Eci *__return_storage_ptr__,SGP4 *this,double tsince)

{
  SatelliteException *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  DateTime local_d8;
  DateTime local_d0 [3];
  double local_b8;
  double tfour;
  double tcube;
  double temp;
  double delm;
  double delomg;
  double templ;
  double tempe;
  double tempa;
  double tsq;
  double xmp;
  double xnoddf;
  double omgadf;
  double xmdf;
  double xinc;
  double xnode;
  double xl;
  double omega;
  double a;
  double e;
  double tsince_local;
  SGP4 *this_local;
  
  e = tsince;
  tsince_local = (double)this;
  this_local = (SGP4 *)__return_storage_ptr__;
  xmdf = OrbitalElements::Inclination(&this->elements_);
  dVar1 = OrbitalElements::MeanAnomoly(&this->elements_);
  omgadf = (this->common_consts_).xmdot * e + dVar1;
  dVar1 = OrbitalElements::ArgumentPerigee(&this->elements_);
  xnoddf = (this->common_consts_).omgdot * e + dVar1;
  dVar1 = OrbitalElements::AscendingNode(&this->elements_);
  xmp = (this->common_consts_).xnodot * e + dVar1;
  xl = xnoddf;
  tsq = omgadf;
  tempa = e * e;
  xinc = (this->common_consts_).xnodcf * tempa + xmp;
  tempe = -(this->common_consts_).c1 * e + 1.0;
  dVar1 = OrbitalElements::BStar(&this->elements_);
  templ = dVar1 * (this->common_consts_).c4 * e;
  delomg = (this->common_consts_).t2cof * tempa;
  if ((this->use_simple_model_ & 1U) == 0) {
    delm = (this->nearspace_consts_).omgcof * e;
    dVar1 = (this->nearspace_consts_).xmcof;
    dVar3 = (this->common_consts_).eta;
    dVar2 = cos(omgadf);
    dVar3 = pow(dVar3 * dVar2 + 1.0,3.0);
    temp = dVar1 * (dVar3 - (this->nearspace_consts_).delmo);
    tcube = delm + temp;
    tsq = tcube + tsq;
    xl = xl - tcube;
    tfour = tempa * e;
    local_b8 = e * tfour;
    tempe = -(this->nearspace_consts_).d4 * local_b8 +
            -(this->nearspace_consts_).d3 * tfour + -(this->nearspace_consts_).d2 * tempa + tempe;
    dVar3 = OrbitalElements::BStar(&this->elements_);
    dVar1 = (this->nearspace_consts_).c5;
    dVar2 = sin(tsq);
    templ = dVar3 * dVar1 * (dVar2 - (this->nearspace_consts_).sinmo) + templ;
    delomg = (this->nearspace_consts_).t3cof * tfour +
             local_b8 * (e * (this->nearspace_consts_).t5cof + (this->nearspace_consts_).t4cof) +
             delomg;
  }
  dVar1 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
  omega = dVar1 * tempe * tempe;
  dVar1 = OrbitalElements::Eccentricity(&this->elements_);
  a = dVar1 - templ;
  dVar1 = tsq + xl + xinc;
  dVar3 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
  xnode = dVar3 * delomg + dVar1;
  if (-0.001 < a) {
    if (1e-06 <= a) {
      if (0.999999 < a) {
        a = 0.999999;
      }
    }
    else {
      a = 1e-06;
    }
    local_d8 = OrbitalElements::Epoch(&this->elements_);
    local_d0[0] = DateTime::AddMinutes(&local_d8,e);
    CalculateFinalPositionVelocity
              (__return_storage_ptr__,local_d0,a,omega,xl,xnode,xinc,xmdf,
               (this->common_consts_).xlcof,(this->common_consts_).aycof,
               (this->common_consts_).x3thm1,(this->common_consts_).x1mth2,
               (this->common_consts_).x7thm1,(this->common_consts_).cosio,
               (this->common_consts_).sinio);
    return __return_storage_ptr__;
  }
  this_00 = (SatelliteException *)__cxa_allocate_exception(0x10);
  SatelliteException::SatelliteException(this_00,"Error: (e <= -0.001)");
  __cxa_throw(this_00,&SatelliteException::typeinfo,SatelliteException::~SatelliteException);
}

Assistant:

Eci SGP4::FindPositionSGP4(double tsince) const
{
    /*
     * the final values
     */
    double e;
    double a;
    double omega;
    double xl;
    double xnode;
    const double xinc = elements_.Inclination();

    /*
     * update for secular gravity and atmospheric drag
     */
    const double xmdf = elements_.MeanAnomoly()
        + common_consts_.xmdot * tsince;
    const double omgadf = elements_.ArgumentPerigee()
        + common_consts_.omgdot * tsince;
    const double xnoddf = elements_.AscendingNode()
        + common_consts_.xnodot * tsince;

    omega = omgadf;
    double xmp = xmdf;

    const double tsq = tsince * tsince;
    xnode = xnoddf + common_consts_.xnodcf * tsq;
    double tempa = 1.0 - common_consts_.c1 * tsince;
    double tempe = elements_.BStar() * common_consts_.c4 * tsince;
    double templ = common_consts_.t2cof * tsq;

    if (!use_simple_model_)
    {
        const double delomg = nearspace_consts_.omgcof * tsince;
        const double delm = nearspace_consts_.xmcof
            * (pow(1.0 + common_consts_.eta * cos(xmdf), 3.0)
                    - nearspace_consts_.delmo);
        const double temp = delomg + delm;

        xmp += temp;
        omega -= temp;

        const double tcube = tsq * tsince;
        const double tfour = tsince * tcube;

        tempa = tempa - nearspace_consts_.d2 * tsq - nearspace_consts_.d3
            * tcube - nearspace_consts_.d4 * tfour;
        tempe += elements_.BStar() * nearspace_consts_.c5
            * (sin(xmp) - nearspace_consts_.sinmo);
        templ += nearspace_consts_.t3cof * tcube + tfour
            * (nearspace_consts_.t4cof + tsince * nearspace_consts_.t5cof);
    }

    a = elements_.RecoveredSemiMajorAxis() * tempa * tempa;
    e = elements_.Eccentricity() - tempe;
    xl = xmp + omega + xnode + elements_.RecoveredMeanMotion() * templ;

    /*
     * fix tolerance for error recognition
     */
    if (e <= -0.001)
    {
        throw SatelliteException("Error: (e <= -0.001)");
    }
    else if (e < 1.0e-6)
    {
        e = 1.0e-6;
    }
    else if (e > (1.0 - 1.0e-6))
    {
        e = 1.0 - 1.0e-6;
    }

    /*
     * using calculated values, find position and velocity
     * we can pass in constants from Initialise() as these dont change
     */
    return CalculateFinalPositionVelocity(elements_.Epoch().AddMinutes(tsince),
                                          e,
                                          a,
                                          omega,
                                          xl,
                                          xnode,
                                          xinc,
                                          common_consts_.xlcof,
                                          common_consts_.aycof,
                                          common_consts_.x3thm1,
                                          common_consts_.x1mth2,
                                          common_consts_.x7thm1,
                                          common_consts_.cosio,
                                          common_consts_.sinio);
}